

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTBoard.cpp
# Opt level: O0

void __thiscall TTTBoard::DrawBoard(TTTBoard *this)

{
  char cVar1;
  ostream *poVar2;
  TTTBoard *this_local;
  
  cVar1 = PrintCell(this,this->m_board[0][0]);
  poVar2 = std::operator<<((ostream *)&std::cout,cVar1);
  poVar2 = std::operator<<(poVar2,"|");
  cVar1 = PrintCell(this,this->m_board[0][1]);
  poVar2 = std::operator<<(poVar2,cVar1);
  poVar2 = std::operator<<(poVar2,"|");
  cVar1 = PrintCell(this,this->m_board[0][2]);
  poVar2 = std::operator<<(poVar2,cVar1);
  std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-----");
  std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
  cVar1 = PrintCell(this,this->m_board[1][0]);
  poVar2 = std::operator<<((ostream *)&std::cout,cVar1);
  poVar2 = std::operator<<(poVar2,"|");
  cVar1 = PrintCell(this,this->m_board[1][1]);
  poVar2 = std::operator<<(poVar2,cVar1);
  poVar2 = std::operator<<(poVar2,"|");
  cVar1 = PrintCell(this,this->m_board[1][2]);
  poVar2 = std::operator<<(poVar2,cVar1);
  std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-----");
  std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
  cVar1 = PrintCell(this,this->m_board[2][0]);
  poVar2 = std::operator<<((ostream *)&std::cout,cVar1);
  poVar2 = std::operator<<(poVar2,"|");
  cVar1 = PrintCell(this,this->m_board[2][1]);
  poVar2 = std::operator<<(poVar2,cVar1);
  poVar2 = std::operator<<(poVar2,"|");
  cVar1 = PrintCell(this,this->m_board[2][2]);
  poVar2 = std::operator<<(poVar2,cVar1);
  std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TTTBoard::DrawBoard() const
{
    cout << PrintCell(m_board[0][0]) << "|"
         << PrintCell(m_board[0][1]) << "|"
         << PrintCell(m_board[0][2]) << endl;

    cout << "-----" << endl;

    cout << PrintCell(m_board[1][0]) << "|"
         << PrintCell(m_board[1][1]) << "|"
         << PrintCell(m_board[1][2]) << endl;

    cout << "-----" << endl;

    cout << PrintCell(m_board[2][0]) << "|"
         << PrintCell(m_board[2][1]) << "|"
         << PrintCell(m_board[2][2]) << endl;
}